

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkreplyhttpimpl.cpp
# Opt level: O3

void __thiscall
QNetworkReplyHttpImplPrivate::wantUploadDataSlot(QNetworkReplyHttpImplPrivate *this,qint64 maxSize)

{
  element_type *peVar1;
  QObject *pQVar2;
  qint64 qVar3;
  undefined1 uVar4;
  char *pcVar5;
  long in_FS_OFFSET;
  qint64 currentUploadDataLength;
  QByteArray local_98;
  long local_78;
  undefined8 local_70;
  undefined1 local_61;
  qint64 local_60;
  void *local_58;
  qint64 *local_50;
  undefined1 *local_48;
  undefined1 *local_40;
  undefined8 *local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  peVar1 = (this->uploadByteDevice).
           super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    pQVar2 = *(QObject **)&(this->super_QNetworkReplyPrivate).field_0x8;
    local_78 = 0;
    pcVar5 = (char *)(**(code **)(*(long *)peVar1 + 0x60))(peVar1,maxSize,&local_78);
    if (local_78 == 0) {
      this->uploadDeviceChoking = true;
    }
    else {
      this->uploadDeviceChoking = false;
      local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_98.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
      QByteArray::QByteArray(&local_98,pcVar5,local_78);
      qVar3 = this->uploadByteDevicePosition;
      uVar4 = (**(code **)(*(long *)(this->uploadByteDevice).
                                    super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr + 0x70))();
      local_70 = (**(code **)(*(long *)(this->uploadByteDevice).
                                       super___shared_ptr<QNonContiguousByteDevice,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + 0x88))();
      local_50 = &local_60;
      local_40 = &local_61;
      local_38 = &local_70;
      local_58 = (void *)0x0;
      local_61 = uVar4;
      local_60 = qVar3;
      local_48 = (undefined1 *)&local_98;
      QMetaObject::activate(pQVar2,&QNetworkReplyHttpImpl::staticMetaObject,5,&local_58);
      if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,1,0x10);
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkReplyHttpImplPrivate::wantUploadDataSlot(qint64 maxSize)
{
    Q_Q(QNetworkReplyHttpImpl);

    if (!uploadByteDevice) // uploadByteDevice is no longer available
        return;

    // call readPointer
    qint64 currentUploadDataLength = 0;
    char *data = const_cast<char*>(uploadByteDevice->readPointer(maxSize, currentUploadDataLength));

    if (currentUploadDataLength == 0) {
        uploadDeviceChoking = true;
        // No bytes from upload byte device. There will be bytes later, it will emit readyRead()
        // and our uploadByteDeviceReadyReadSlot() is called.
        return;
    } else {
        uploadDeviceChoking = false;
    }

    // Let's make a copy of this data
    QByteArray dataArray(data, currentUploadDataLength);

    // Communicate back to HTTP thread
    emit q->haveUploadData(uploadByteDevicePosition, dataArray, uploadByteDevice->atEnd(), uploadByteDevice->size());
}